

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,mtree_entry_conflict *me
                    )

{
  attr_counter *paVar1;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  attr_counter *pac;
  attr_counter *in_stack_ffffffffffffffc8;
  mtree_entry_conflict *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  
  if (in_RSI == (long *)0x0) {
    paVar1 = attr_counter_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (paVar1 == (attr_counter *)0x0) {
      return -1;
    }
    *(attr_counter **)(in_RDX + 8) = paVar1;
  }
  else {
    *(int *)(in_RSI + 3) = (int)in_RSI[3] + 1;
    if (((long *)*in_RDI == in_RSI) || ((int)in_RSI[3] <= *(int *)(*in_RSI + 0x18))) {
      return 0;
    }
    for (puVar2 = (undefined8 *)*in_RSI;
        (puVar2 != (undefined8 *)0x0 && (*(int *)(puVar2 + 3) < (int)in_RSI[3]));
        puVar2 = (undefined8 *)*puVar2) {
    }
    *(long *)(*in_RSI + 8) = in_RSI[1];
    if (in_RSI[1] != 0) {
      *(long *)in_RSI[1] = *in_RSI;
    }
    if (puVar2 == (undefined8 *)0x0) {
      *in_RSI = 0;
      in_RSI[1] = *in_RDI;
      *in_RDI = (long)in_RSI;
      *(long **)in_RSI[1] = in_RSI;
    }
    else {
      *in_RSI = (long)puVar2;
      in_RSI[1] = puVar2[1];
      puVar2[1] = in_RSI;
      if (in_RSI[1] != 0) {
        *(long **)in_RSI[1] = in_RSI;
      }
    }
  }
  return 0;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}